

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circularBuffer.c
# Opt level: O0

int get_state(void)

{
  int iVar1;
  int local_c;
  int i;
  
  iVar1 = sem_wait((sem_t *)write_sem);
  if (iVar1 == 0) {
    local_c = buf->state;
    iVar1 = sem_post((sem_t *)write_sem);
    if (iVar1 != 0) {
      local_c = -1;
    }
  }
  else {
    local_c = -1;
  }
  return local_c;
}

Assistant:

int get_state()
{
    int i;
    if (sem_wait(write_sem) != 0)
    {
        return -1;
    }
    i = buf->state;
    if (sem_post(write_sem) != 0)
    {
        return -1;
    }
    return i;
}